

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transreg.cpp
# Opt level: O0

void __thiscall
icu_63::TransliteratorSpec::TransliteratorSpec(TransliteratorSpec *this,UnicodeString *theSpec)

{
  UBool UVar1;
  int32_t iVar2;
  ResourceBundle *this_00;
  CharString *this_01;
  char *pcVar3;
  Locale *result;
  ResourceBundle *local_248;
  undefined1 local_210 [8];
  UnicodeString locStr;
  CharString local_190;
  int32_t local_14c;
  UScriptCode UStack_148;
  int32_t num;
  UScriptCode script [10];
  undefined1 local_108 [8];
  Locale topLoc;
  UErrorCode status;
  UnicodeString *theSpec_local;
  TransliteratorSpec *this_local;
  
  icu_63::UnicodeString::UnicodeString(&this->top,theSpec);
  icu_63::UnicodeString::UnicodeString(&this->spec);
  icu_63::UnicodeString::UnicodeString(&this->nextSpec);
  icu_63::UnicodeString::UnicodeString(&this->scriptName);
  this->res = (ResourceBundle *)0x0;
  topLoc.fIsBogus = '\0';
  topLoc._217_3_ = 0;
  Locale::Locale((Locale *)local_108,"",(char *)0x0,(char *)0x0,(char *)0x0);
  result = (Locale *)local_108;
  LocaleUtility::initLocaleFromName(theSpec,result);
  UVar1 = Locale::isBogus((Locale *)local_108);
  if (UVar1 == '\0') {
    this_00 = (ResourceBundle *)UMemory::operator_new((UMemory *)0x18,(size_t)result);
    local_248 = (ResourceBundle *)0x0;
    if (this_00 != (ResourceBundle *)0x0) {
      ResourceBundle::ResourceBundle
                (this_00,"icudt63l-translit",(Locale *)local_108,(UErrorCode *)&topLoc.fIsBogus);
      local_248 = this_00;
    }
    this->res = local_248;
    if (this->res == (ResourceBundle *)0x0) goto LAB_002e654d;
    UVar1 = ::U_FAILURE(topLoc._216_4_);
    if ((UVar1 != '\0') || (topLoc._216_4_ == -0x7f)) {
      if (this->res != (ResourceBundle *)0x0) {
        (*(this->res->super_UObject)._vptr_UObject[1])();
      }
      this->res = (ResourceBundle *)0x0;
    }
  }
  topLoc.fIsBogus = '\0';
  topLoc._217_3_ = 0;
  script[2] = USCRIPT_COMMON;
  script[3] = USCRIPT_COMMON;
  script[4] = USCRIPT_COMMON;
  script[5] = USCRIPT_COMMON;
  script[0] = USCRIPT_COMMON;
  script[1] = USCRIPT_COMMON;
  script[6] = USCRIPT_COMMON;
  script[7] = USCRIPT_COMMON;
  _UStack_148 = 0xffffffff;
  CharString::CharString(&local_190);
  this_01 = CharString::appendInvariantChars(&local_190,theSpec,(UErrorCode *)&topLoc.fIsBogus);
  pcVar3 = CharString::data(this_01);
  iVar2 = uscript_getCode_63(pcVar3,&UStack_148,10,(UErrorCode *)&topLoc.fIsBogus);
  CharString::~CharString(&local_190);
  local_14c = iVar2;
  if ((0 < iVar2) && (UStack_148 != USCRIPT_INVALID_CODE)) {
    pcVar3 = uscript_getName_63(UStack_148);
    icu_63::UnicodeString::UnicodeString
              ((UnicodeString *)((long)&locStr.fUnion + 0x30),pcVar3,-1,kInvariant);
    icu_63::UnicodeString::operator=
              (&this->scriptName,(UnicodeString *)((long)&locStr.fUnion + 0x30));
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)((long)&locStr.fUnion + 0x30));
  }
  if (this->res == (ResourceBundle *)0x0) {
    iVar2 = icu_63::UnicodeString::length(&this->scriptName);
    if (iVar2 != 0) {
      icu_63::UnicodeString::operator=(&this->top,&this->scriptName);
    }
  }
  else {
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_210);
    LocaleUtility::initNameFromLocale((Locale *)local_108,(UnicodeString *)local_210);
    UVar1 = icu_63::UnicodeString::isBogus((UnicodeString *)local_210);
    if (UVar1 == '\0') {
      icu_63::UnicodeString::operator=(&this->top,(UnicodeString *)local_210);
    }
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_210);
  }
  reset(this);
LAB_002e654d:
  Locale::~Locale((Locale *)local_108);
  return;
}

Assistant:

TransliteratorSpec::TransliteratorSpec(const UnicodeString& theSpec)
: top(theSpec),
  res(0)
{
    UErrorCode status = U_ZERO_ERROR;
    Locale topLoc("");
    LocaleUtility::initLocaleFromName(theSpec, topLoc);
    if (!topLoc.isBogus()) {
        res = new ResourceBundle(U_ICUDATA_TRANSLIT, topLoc, status);
        /* test for NULL */
        if (res == 0) {
            return;
        }
        if (U_FAILURE(status) || status == U_USING_DEFAULT_WARNING) {
            delete res;
            res = 0;
        }
    }

    // Canonicalize script name -or- do locale->script mapping
    status = U_ZERO_ERROR;
    static const int32_t capacity = 10;
    UScriptCode script[capacity]={USCRIPT_INVALID_CODE};
    int32_t num = uscript_getCode(CharString().appendInvariantChars(theSpec, status).data(),
                                  script, capacity, &status);
    if (num > 0 && script[0] != USCRIPT_INVALID_CODE) {
        scriptName = UnicodeString(uscript_getName(script[0]), -1, US_INV);
    }

    // Canonicalize top
    if (res != 0) {
        // Canonicalize locale name
        UnicodeString locStr;
        LocaleUtility::initNameFromLocale(topLoc, locStr);
        if (!locStr.isBogus()) {
            top = locStr;
        }
    } else if (scriptName.length() != 0) {
        // We are a script; use canonical name
        top = scriptName;
    }

    // assert(spec != top);
    reset();
}